

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

bool __thiscall QFontDialogPrivate::canBeNativeDialog(QFontDialogPrivate *this)

{
  undefined8 *puVar1;
  byte bVar2;
  bool bVar3;
  Int IVar4;
  int iVar5;
  char *__s1;
  char *__s2;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  QDialog *q;
  int in_stack_ffffffffffffffbc;
  QFlags<QFontDialogOptions::FontDialogOption> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  bool local_11;
  QFlagsStorageHelper<QFontDialogOptions::FontDialogOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined8 **)(in_RDI + 8);
  if ((*(byte *)(in_RDI + 0x2c8) & 1) == 0) {
    bVar2 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
    bVar6 = true;
    if ((bVar2 & 1) == 0) {
      bVar3 = QWidget::testAttribute
                        ((QWidget *)CONCAT17(1,in_stack_ffffffffffffffc8),
                         (WidgetAttribute)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      bVar6 = true;
      if (!bVar3) {
        QSharedPointer<QFontDialogOptions>::operator->
                  ((QSharedPointer<QFontDialogOptions> *)0x796a35);
        QFontDialogOptions::options();
        local_c.super_QFlagsStorage<QFontDialogOptions::FontDialogOption>.i =
             (QFlagsStorage<QFontDialogOptions::FontDialogOption>)
             QFlags<QFontDialogOptions::FontDialogOption>::operator&
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
        bVar6 = IVar4 != 0;
      }
    }
    if (bVar6) {
      local_11 = false;
    }
    else {
      __s1 = (char *)QMetaObject::className();
      (**(code **)*puVar1)();
      __s2 = (char *)QMetaObject::className();
      iVar5 = strcmp(__s1,__s2);
      local_11 = iVar5 == 0;
    }
  }
  else {
    local_11 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QFontDialogPrivate::canBeNativeDialog() const
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const QDialog * const q = static_cast<const QDialog*>(q_ptr);
    if (nativeDialogInUse)
        return true;
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs)
        || q->testAttribute(Qt::WA_DontShowOnScreen)
        || (options->options() & QFontDialog::DontUseNativeDialog)) {
        return false;
    }

    return strcmp(QFontDialog::staticMetaObject.className(), q->metaObject()->className()) == 0;
}